

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O3

bool __thiscall slang::driver::Driver::parseAllSources(Driver *this)

{
  pointer pbVar1;
  pointer pbVar2;
  DiagnosticEngine *this_00;
  Diagnostic *ctx;
  long lVar3;
  iterator __begin3;
  pointer message;
  Diagnostic *diagnostic;
  Bag optionBag;
  Diagnostics pragmaDiags;
  SyntaxTreeList local_178;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  local_158;
  Diagnostics local_128;
  
  local_158.arrays.groups_size_index = 0x3f;
  local_158.arrays.groups_size_mask = 1;
  local_158.arrays.elements_ = (value_type_pointer)0x0;
  local_158.arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_158.size_ctrl.ml = 0;
  local_158.size_ctrl.size = 0;
  addParseOptions(this,(Bag *)&local_158);
  SourceLoader::loadAndParseSources(&local_178,&this->sourceLoader,(Bag *)&local_158);
  local_128.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.cap =
       (size_type)
       (this->syntaxTrees).
       super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->syntaxTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_178.
       super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_128.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.data_
       = (pointer)(this->syntaxTrees).
                  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_128.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.len =
       (size_type)
       (this->syntaxTrees).
       super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->syntaxTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_178.
       super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->syntaxTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_178.
       super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_178.
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ::~vector((vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
             *)&local_128);
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ::~vector(&local_178);
  pbVar1 = (this->sourceLoader).errors.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->sourceLoader).errors.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  message = pbVar1;
  if (pbVar2 == pbVar1) {
    this_00 = &this->diagEngine;
    ctx = (Diagnostic *)this_00;
    DiagnosticEngine::setMappingsFromPragmas(&local_128,this_00);
    if ((pointer)local_128.super_SmallVector<slang::Diagnostic,_2UL>.
                 super_SmallVectorBase<slang::Diagnostic>.len != (pointer)0x0) {
      lVar3 = local_128.super_SmallVector<slang::Diagnostic,_2UL>.
              super_SmallVectorBase<slang::Diagnostic>.len * 0x70;
      diagnostic = local_128.super_SmallVector<slang::Diagnostic,_2UL>.
                   super_SmallVectorBase<slang::Diagnostic>.data_;
      do {
        ctx = diagnostic;
        DiagnosticEngine::issue(this_00,diagnostic);
        diagnostic = diagnostic + 1;
        lVar3 = lVar3 + -0x70;
      } while (lVar3 != 0);
    }
    SmallVectorBase<slang::Diagnostic>::cleanup
              ((SmallVectorBase<slang::Diagnostic> *)&local_128,(EVP_PKEY_CTX *)ctx);
  }
  else {
    do {
      printError(this,message);
      message = message + 1;
    } while (message != pbVar2);
  }
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core(&local_158);
  return pbVar2 == pbVar1;
}

Assistant:

bool Driver::parseAllSources() {
    Bag optionBag;
    addParseOptions(optionBag);

    syntaxTrees = sourceLoader.loadAndParseSources(optionBag);
    if (!reportLoadErrors())
        return false;

    Diagnostics pragmaDiags = diagEngine.setMappingsFromPragmas();
    for (auto& diag : pragmaDiags)
        diagEngine.issue(diag);

    return true;
}